

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::slashMod(Forth *this)

{
  ldiv_t lVar1;
  ldiv_t result;
  allocator<char> local_39;
  string local_38;
  uint local_18;
  uint local_14;
  SCell n1;
  SCell n2;
  Forth *this_local;
  
  _n1 = this;
  requireDStackDepth(this,2,"/MOD");
  local_14 = ForthStack<unsigned_int>::getTop(&this->dStack);
  local_18 = ForthStack<unsigned_int>::getTop(&this->dStack,1);
  if (local_14 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"/MOD: zero divisor",&local_39);
    throwCppExceptionMessage(this,&local_38,errorDivisionByZero);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  lVar1 = ldiv((long)(int)local_18,(long)(int)local_14);
  ForthStack<unsigned_int>::setTop(&this->dStack,1,(uint)lVar1.rem);
  ForthStack<unsigned_int>::setTop(&this->dStack,(uint)lVar1.quot);
  return;
}

Assistant:

void slashMod() {
			REQUIRE_DSTACK_DEPTH(2, "/MOD");
			auto n2 = static_cast<SCell>(dStack.getTop());
			auto n1 = static_cast<SCell>(dStack.getTop(1));
			RUNTIME_ERROR_IF(n2 == 0, "/MOD: zero divisor", errorDivisionByZero);
			auto result = std::ldiv(n1, n2);
			dStack.setTop(1, static_cast<Cell>(result.rem));
			dStack.setTop(static_cast<Cell>(result.quot));
		}